

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_aggregate.cpp
# Opt level: O1

void __thiscall
duckdb::HashAggregateGlobalSinkState::HashAggregateGlobalSinkState
          (HashAggregateGlobalSinkState *this,PhysicalHashAggregate *op,ClientContext *context)

{
  vector<duckdb::LogicalType,_true> *this_00;
  pointer puVar1;
  pointer puVar2;
  HashAggregateGlobalSinkState *pHVar3;
  const_reference __args;
  pointer pEVar4;
  BoundAggregateExpression *pBVar5;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *child;
  size_type __n;
  pointer this_01;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *aggr;
  pointer this_02;
  vector<duckdb::LogicalType,_true> filter_types;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_58;
  HashAggregateGlobalSinkState *local_40;
  vector<duckdb::HashAggregateGroupingGlobalState,std::allocator<duckdb::HashAggregateGroupingGlobalState>>
  *local_38;
  
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.can_block._M_base._M_i = true;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __align = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 0x10) = 0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__next = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->super_GlobalSinkState).state = READY;
  (this->super_GlobalSinkState)._vptr_GlobalSinkState =
       (_func_int **)&PTR__HashAggregateGlobalSinkState_02499b90;
  local_38 = (vector<duckdb::HashAggregateGroupingGlobalState,std::allocator<duckdb::HashAggregateGroupingGlobalState>>
              *)&this->grouping_states;
  (this->grouping_states).
  super_vector<duckdb::HashAggregateGroupingGlobalState,_std::allocator<duckdb::HashAggregateGroupingGlobalState>_>
  .
  super__Vector_base<duckdb::HashAggregateGroupingGlobalState,_std::allocator<duckdb::HashAggregateGroupingGlobalState>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->grouping_states).
  super_vector<duckdb::HashAggregateGroupingGlobalState,_std::allocator<duckdb::HashAggregateGroupingGlobalState>_>
  .
  super__Vector_base<duckdb::HashAggregateGroupingGlobalState,_std::allocator<duckdb::HashAggregateGroupingGlobalState>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->grouping_states).
  super_vector<duckdb::HashAggregateGroupingGlobalState,_std::allocator<duckdb::HashAggregateGroupingGlobalState>_>
  .
  super__Vector_base<duckdb::HashAggregateGroupingGlobalState,_std::allocator<duckdb::HashAggregateGroupingGlobalState>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->payload_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->payload_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->payload_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->finished = false;
  this_00 = &this->payload_types;
  local_40 = this;
  ::std::
  vector<duckdb::HashAggregateGroupingGlobalState,_std::allocator<duckdb::HashAggregateGroupingGlobalState>_>
  ::reserve((vector<duckdb::HashAggregateGroupingGlobalState,_std::allocator<duckdb::HashAggregateGroupingGlobalState>_>
             *)local_38,
            ((long)(op->groupings).
                   super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                   .
                   super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(op->groupings).
                   super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                   .
                   super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7);
  if ((op->groupings).
      super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
      .
      super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (op->groupings).
      super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
      .
      super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      __args = vector<duckdb::HashAggregateGroupingData,_true>::operator[](&op->groupings,__n);
      ::std::
      vector<duckdb::HashAggregateGroupingGlobalState,std::allocator<duckdb::HashAggregateGroupingGlobalState>>
      ::emplace_back<duckdb::HashAggregateGroupingData_const&,duckdb::ClientContext&>
                (local_38,__args,context);
      __n = __n + 1;
    } while (__n < (ulong)(((long)(op->groupings).
                                  super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                  .
                                  super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(op->groupings).
                                  super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                  .
                                  super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4) *
                          0x6db6db6db6db6db7));
  }
  local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar1 = (op->grouped_aggregate_data).aggregates.
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_02 = (op->grouped_aggregate_data).aggregates.
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pHVar3 = local_40, this_02 != puVar1;
      this_02 = this_02 + 1) {
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_02);
    pBVar5 = BaseExpression::Cast<duckdb::BoundAggregateExpression>(&pEVar4->super_BaseExpression);
    puVar2 = (pBVar5->children).
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_01 = (pBVar5->children).
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_01 != puVar2;
        this_01 = this_01 + 1) {
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_01);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&this_00->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 &pEVar4->return_type);
    }
    if ((pBVar5->filter).
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(&pBVar5->filter);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&local_58,&pEVar4->return_type);
    }
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::reserve
            (&this_00->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             ((long)local_58.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_58.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
             ((long)(local_40->payload_types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(local_40->payload_types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<duckdb::LogicalType*,std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>>>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)this_00,
             (pHVar3->payload_types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish,
             local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             _M_impl.super__Vector_impl_data._M_start,
             local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_58);
  return;
}

Assistant:

HashAggregateGlobalSinkState(const PhysicalHashAggregate &op, ClientContext &context) {
		grouping_states.reserve(op.groupings.size());
		for (idx_t i = 0; i < op.groupings.size(); i++) {
			auto &grouping = op.groupings[i];
			grouping_states.emplace_back(grouping, context);
		}
		vector<LogicalType> filter_types;
		for (auto &aggr : op.grouped_aggregate_data.aggregates) {
			auto &aggregate = aggr->Cast<BoundAggregateExpression>();
			for (auto &child : aggregate.children) {
				payload_types.push_back(child->return_type);
			}
			if (aggregate.filter) {
				filter_types.push_back(aggregate.filter->return_type);
			}
		}
		payload_types.reserve(payload_types.size() + filter_types.size());
		payload_types.insert(payload_types.end(), filter_types.begin(), filter_types.end());
	}